

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

atf_error_t atf_tc_set_md_var(atf_tc_t *tc,char *key,char *value,...)

{
  int iVar1;
  size_t __n;
  atf_error_t paVar2;
  ulong local_38;
  size_t i;
  size_t key_length;
  char *value_local;
  char *key_local;
  atf_tc_t *tc_local;
  
  __n = strlen(key);
  local_38 = 0;
  while( true ) {
    if (tc->impl_->variables_size <= local_38) {
      if (tc->impl_->variables_size == 0x80) {
        tc_local = (atf_tc_t *)microatf_error_too_many_variables();
      }
      else {
        tc->impl_->variables_key[tc->impl_->variables_size] = key;
        tc->impl_->variables_value[tc->impl_->variables_size] = value;
        tc->impl_->variables_size = tc->impl_->variables_size + 1;
        tc_local = (atf_tc_t *)atf_no_error();
      }
      return (atf_error_t)tc_local;
    }
    iVar1 = strncmp(tc->impl_->variables_key[local_38],key,__n);
    if (iVar1 == 0) break;
    local_38 = local_38 + 1;
  }
  tc->impl_->variables_value[local_38] = value;
  paVar2 = atf_no_error();
  return paVar2;
}

Assistant:

atf_error_t
atf_tc_set_md_var(atf_tc_t *tc, char const *key, char const *value, ...)
{
	size_t key_length = strlen(key);

	for (size_t i = 0; i < tc->impl_->variables_size; ++i) {
		if (strncmp(tc->impl_->variables_key[i], /**/
			key, key_length) == 0) {
			tc->impl_->variables_value[i] = value;
			return atf_no_error();
		}
	}

	if (tc->impl_->variables_size == 128) {
		return microatf_error_too_many_variables();
	}

	tc->impl_->variables_key[tc->impl_->variables_size] = key;
	tc->impl_->variables_value[tc->impl_->variables_size] = value;

	++tc->impl_->variables_size;

	return atf_no_error();
}